

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O2

void glu::TextureTestUtil::fetchTexture
               (SurfaceAccess *dst,ConstPixelBufferAccess *src,float *texCoord,Vec4 *colorScale,
               Vec4 *colorBias)

{
  bool bVar1;
  ulong uVar2;
  int y;
  int y_00;
  int x;
  int x_00;
  float fVar3;
  float extraout_XMM0_Db;
  float fVar4;
  float extraout_XMM0_Dd;
  undefined1 in_XMM1 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined8 uVar11;
  Vector<float,_4> VVar12;
  float local_98 [8];
  float local_78;
  float fStack_74;
  undefined4 uStack_70;
  float fStack_6c;
  undefined1 local_60 [32];
  tcu local_40 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  fVar3 = texCoord[1];
  fVar4 = texCoord[3];
  local_98[0] = *texCoord;
  local_98[1] = fVar3;
  local_98[2] = texCoord[2];
  local_98[3] = fVar4;
  local_98[4] = texCoord[2];
  local_98[5] = fVar3;
  y_00 = 0;
  do {
    if (dst->m_height <= y_00) {
      return;
    }
    local_78 = (float)y_00 + 0.5;
    uStack_70 = 0;
    fStack_74 = fVar3;
    fStack_6c = fVar4;
    for (x_00 = 0; x_00 < dst->m_width; x_00 = x_00 + 1) {
      auVar5._4_12_ = in_XMM1._4_12_;
      auVar5._0_4_ = (float)x_00 + 0.5;
      auVar7._12_4_ = in_XMM1._12_4_;
      auVar7._0_8_ = auVar5._0_8_;
      auVar7._8_4_ = in_XMM1._4_4_;
      auVar6._8_8_ = auVar7._8_8_;
      auVar6._4_4_ = local_78;
      auVar6._0_4_ = auVar5._0_4_;
      auVar8._0_12_ = auVar6._0_12_;
      auVar8._12_4_ = fStack_74;
      auVar9._0_4_ = (float)dst->m_width;
      auVar9._4_4_ = (float)dst->m_height;
      auVar9._8_8_ = 0;
      auVar9 = divps(auVar8,auVar9);
      auVar10._4_4_ = auVar9._4_4_;
      bVar1 = 1.0 <= auVar9._0_4_ + auVar10._4_4_;
      if (bVar1) {
        auVar9 = ZEXT416((uint)(1.0 - auVar9._0_4_));
        if (!bVar1) goto LAB_01543f16;
LAB_01543f04:
        fVar3 = auVar9._0_4_;
        auVar10 = ZEXT416((uint)(1.0 - auVar10._4_4_));
      }
      else {
        if (bVar1) goto LAB_01543f04;
LAB_01543f16:
        fVar3 = auVar9._0_4_;
        auVar10._0_4_ = auVar10._4_4_;
        auVar10._8_4_ = auVar10._4_4_;
        auVar10._12_4_ = auVar10._4_4_;
      }
      uVar11 = auVar10._8_8_;
      uVar2 = (ulong)bVar1;
      fVar4 = local_98[uVar2 * 3];
      tcu::ConstPixelBufferAccess::getPixel
                ((ConstPixelBufferAccess *)local_60,(int)src,
                 (int)((local_98[uVar2 * 3 + 1] - fVar4) * auVar10._0_4_ +
                      (local_98[uVar2 * 3 + 2] - fVar4) * fVar3 + fVar4),0);
      tcu::operator*((tcu *)(local_60 + 0x10),(Vector<float,_4> *)local_60,colorScale);
      VVar12 = tcu::operator+(local_40,(Vector<float,_4> *)(local_60 + 0x10),colorBias);
      in_XMM1._0_8_ = VVar12.m_data._8_8_;
      in_XMM1._8_8_ = uVar11;
      tcu::SurfaceAccess::setPixel(dst,(Vec4 *)local_40,x_00,y_00);
      fVar3 = extraout_XMM0_Db;
      fVar4 = extraout_XMM0_Dd;
    }
    y_00 = y_00 + 1;
  } while( true );
}

Assistant:

void fetchTexture (const tcu::SurfaceAccess& dst, const tcu::ConstPixelBufferAccess& src, const float* texCoord, const tcu::Vec4& colorScale, const tcu::Vec4& colorBias)
{
	const tcu::Vec4		sq			= tcu::Vec4(texCoord[0], texCoord[1], texCoord[2], texCoord[3]);
	const tcu::Vec3		triS[2]		= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };

	for (int y = 0; y < dst.getHeight(); y++)
	{
		for (int x = 0; x < dst.getWidth(); x++)
		{
			const float	yf		= ((float)y + 0.5f) / (float)dst.getHeight();
			const float	xf		= ((float)x + 0.5f) / (float)dst.getWidth();

			const int	triNdx	= xf + yf >= 1.0f ? 1 : 0; // Top left fill rule.
			const float	triX	= triNdx ? 1.0f-xf : xf;
			const float	triY	= triNdx ? 1.0f-yf : yf;

			const float	s		= triangleInterpolate(triS[triNdx].x(), triS[triNdx].y(), triS[triNdx].z(), triX, triY);

			dst.setPixel(src.getPixel((int)s, 0) * colorScale + colorBias, x, y);
		}
	}
}